

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall sf2cute::SoundFont::~SoundFont(SoundFont *this)

{
  std::__cxx11::string::~string((string *)&this->software_);
  std::__cxx11::string::~string((string *)&this->comment_);
  std::__cxx11::string::~string((string *)&this->copyright_);
  std::__cxx11::string::~string((string *)&this->product_);
  std::__cxx11::string::~string((string *)&this->engineers_);
  std::__cxx11::string::~string((string *)&this->creation_date_);
  std::__cxx11::string::~string((string *)&this->rom_name_);
  std::__cxx11::string::~string((string *)&this->bank_name_);
  std::__cxx11::string::~string((string *)&this->sound_engine_);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  ~vector(&this->samples_);
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::~vector(&this->instruments_);
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  ~vector(&this->presets_);
  return;
}

Assistant:

~SoundFont() = default;